

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void set_bordering_walls(chunk_conflict *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc_conflict grid_06;
  loc grid_07;
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  void *p;
  wchar_t local_78;
  wchar_t local_74;
  wchar_t local_70;
  wchar_t local_6c;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t local_60;
  wchar_t local_5c;
  wchar_t wStack_54;
  wchar_t wStack_50;
  _Bool floor;
  loc adj;
  wchar_t nfloor;
  wchar_t adjx2;
  wchar_t adjx1;
  wchar_t adjy2;
  wchar_t adjy1;
  _Bool *walls;
  wchar_t wStack_28;
  loc grid;
  wchar_t nx;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  chunk_conflict *c_local;
  
  if ((x2 < x1) || (y2 < y1)) {
    __assert_fail("x2 >= x1 && y2 >= y1",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                  ,0x1df,"void set_bordering_walls(struct chunk *, int, int, int, int)");
  }
  iVar3 = (x2 - x1) + 1;
  p = mem_zalloc((long)(((x2 - x1) + 1) * ((y2 - y1) + 1)));
  local_5c = y1;
  if (y1 < L'\x01') {
    local_5c = L'\0';
  }
  local_60 = y2;
  if (c->height + L'\xffffffff' <= y2) {
    local_60 = c->height + L'\xffffffff';
  }
  local_64 = x1;
  if (x1 < L'\x01') {
    local_64 = L'\0';
  }
  local_68 = x2;
  if (c->width + L'\xffffffff' <= x2) {
    local_68 = c->width + L'\xffffffff';
  }
  wStack_28 = local_5c;
  do {
    if (local_60 < wStack_28) {
      wStack_28 = local_5c;
      do {
        if (local_60 < wStack_28) {
          mem_free(p);
          return;
        }
        for (walls._4_4_ = local_64; walls._4_4_ <= local_68; walls._4_4_ = walls._4_4_ + L'\x01') {
          if ((*(byte *)((long)p + (long)((walls._4_4_ - local_64) + iVar3 * (wStack_28 - local_5c))
                        ) & 1) != 0) {
            grid_05.y = wStack_28;
            grid_05.x = walls._4_4_;
            _Var1 = square_isfloor((chunk *)c,grid_05);
            if ((!_Var1) ||
               (grid_06.y = wStack_28, grid_06.x = walls._4_4_,
               _Var1 = square_isroom((chunk *)c,grid_06), !_Var1)) {
              __assert_fail("square_isfloor(c, grid) && square_isroom(c, grid)",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                            ,0x226,"void set_bordering_walls(struct chunk *, int, int, int, int)");
            }
            grid_07.y = wStack_28;
            grid_07.x = walls._4_4_;
            set_marked_granite(c,grid_07,L'\f');
          }
        }
        wStack_28 = wStack_28 + L'\x01';
      } while( true );
    }
    if (wStack_28 + L'\xffffffff' < 1) {
      local_6c = L'\0';
    }
    else {
      local_6c = wStack_28 + L'\xffffffff';
    }
    if (wStack_28 + L'\x01' < c->height + -1) {
      local_70 = wStack_28 + L'\x01';
    }
    else {
      local_70 = c->height + L'\xffffffff';
    }
    for (walls._4_4_ = local_64; walls._4_4_ <= local_68; walls._4_4_ = walls._4_4_ + L'\x01') {
      grid_02.y = wStack_28;
      grid_02.x = walls._4_4_;
      _Var1 = square_isfloor((chunk *)c,grid_02);
      if (_Var1) {
        if (walls._4_4_ + L'\xffffffff' < 1) {
          local_74 = L'\0';
        }
        else {
          local_74 = walls._4_4_ + L'\xffffffff';
        }
        if (walls._4_4_ + L'\x01' < c->width + -1) {
          local_78 = walls._4_4_ + L'\x01';
        }
        else {
          local_78 = c->width + L'\xffffffff';
        }
        grid_03.y = wStack_28;
        grid_03.x = walls._4_4_;
        _Var1 = square_isroom((chunk *)c,grid_03);
        if (!_Var1) {
          __assert_fail("square_isroom(c, grid)",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                        ,0x1f2,"void set_bordering_walls(struct chunk *, int, int, int, int)");
        }
        if ((local_70 - local_6c == 2) && (local_78 - local_74 == 2)) {
          adj.x = 0;
          for (wStack_50 = local_6c; wStack_50 <= local_70; wStack_50 = wStack_50 + L'\x01') {
            for (wStack_54 = local_74; wStack_54 <= local_78; wStack_54 = wStack_54 + L'\x01') {
              grid_00.y = wStack_50;
              grid_00.x = wStack_54;
              _Var1 = square_isfloor((chunk *)c,grid_00);
              grid_01.y = wStack_50;
              grid_01.x = wStack_54;
              _Var2 = square_isroom((chunk *)c,grid_01);
              if (_Var1 != _Var2) {
                __assert_fail("floor == square_isroom( c, adj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x20b,"void set_bordering_walls(struct chunk *, int, int, int, int)")
                ;
              }
              if (_Var1) {
                adj.x = adj.x + 1;
              }
            }
          }
          if (adj.x != 9) {
            *(undefined1 *)
             ((long)p + (long)((walls._4_4_ - local_64) + iVar3 * (wStack_28 - local_5c))) = 1;
          }
        }
        else {
          *(undefined1 *)
           ((long)p + (long)((walls._4_4_ - local_64) + iVar3 * (wStack_28 - local_5c))) = 1;
        }
      }
      else {
        grid_04.y = wStack_28;
        grid_04.x = walls._4_4_;
        _Var1 = square_isroom((chunk *)c,grid_04);
        if (_Var1) {
          __assert_fail("!square_isroom(c, grid)",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                        ,0x21c,"void set_bordering_walls(struct chunk *, int, int, int, int)");
        }
      }
    }
    wStack_28 = wStack_28 + L'\x01';
  } while( true );
}

Assistant:

static void set_bordering_walls(struct chunk *c, int y1, int x1, int y2, int x2)
{
	int nx;
	struct loc grid;
	bool *walls;

	assert(x2 >= x1 && y2 >= y1);

	/* Set up storage to track which grids to convert. */
	nx = x2 - x1 + 1;
	walls = mem_zalloc((x2 - x1 + 1) * (y2 - y1 + 1) * sizeof(*walls));

	/* Find the grids to convert. */
	y1 = MAX(0, y1);
	y2 = MIN(c->height - 1, y2);
	x1 = MAX(0, x1);
	x2 = MIN(c->width - 1, x2);
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		int adjy1 = MAX(0, grid.y - 1);
		int adjy2 = MIN(c->height - 1, grid.y + 1);

		for (grid.x = x1; grid.x <= x2; grid.x++) {
			if (square_isfloor(c, grid)) {
				int adjx1 = MAX(0, grid.x - 1);
				int adjx2 = MIN(c->width - 1, grid.x + 1);
				assert(square_isroom(c, grid));

				if (adjy2 - adjy1 != 2 || adjx2 - adjx1 != 2) {
					/*
					 * Adjacent grids are out of bounds.
					 * Make it an outer wall.
					 */
					walls[grid.x - x1 + nx *
						(grid.y - y1)] = true;
				} else {
					int nfloor = 0;
					struct loc adj;

					for (adj.y = adjy1;
							adj.y <= adjy2;
							adj.y++) {
						for (adj.x = adjx1;
								adj.x <= adjx2;
								adj.x++) {
							bool floor =
								square_isfloor(
								c, adj);

							assert(floor ==
								square_isroom(
								c, adj));
							if (floor) {
								++nfloor;
							}
						}
					}
					if (nfloor != 9) {
						/*
						 * At least one neighbor is not
						 * in the room.  Make it an
						 * outer wall.
						 */
						walls[grid.x - x1 + nx *
							(grid.y - y1)] = true;
					}
				}
			} else {
				assert(!square_isroom(c, grid));
			}
		}
	}

	/* Perform the floor to wall conversions. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			if (walls[grid.x - x1 + nx * (grid.y - y1)]) {
				assert(square_isfloor(c, grid) &&
					square_isroom(c, grid));
				set_marked_granite(c, grid, SQUARE_WALL_OUTER);
			}
		}
	}

	mem_free(walls);
}